

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skynet_daemon.c
# Opt level: O2

int daemon_init(char *pidfile)

{
  int iVar1;
  __pid_t _Var2;
  int iVar3;
  uint uVar4;
  FILE *pFVar5;
  int *piVar6;
  char *pcVar7;
  size_t sStack_40;
  int pid;
  uint local_2c;
  
  pid = 0;
  pFVar5 = fopen(pidfile,"r");
  if (pFVar5 != (FILE *)0x0) {
    iVar1 = __isoc99_fscanf(pFVar5,"%d",&pid);
    fclose(pFVar5);
    iVar3 = pid;
    if ((((pid != 0 && iVar1 == 1) && (_Var2 = getpid(), iVar3 != _Var2)) &&
        ((iVar3 = kill(pid,0), iVar3 == 0 || (piVar6 = __errno_location(), *piVar6 != 3)))) &&
       (pid != 0)) {
      fprintf(_stderr,"Skynet is already running, pid = %d.\n");
      return 1;
    }
  }
  iVar3 = daemon(1,0);
  if (iVar3 == 0) {
    local_2c = 0;
    iVar3 = open(pidfile,0x42,0x1a4);
    if (iVar3 == -1) {
      pcVar7 = "Can\'t create %s.\n";
    }
    else {
      pFVar5 = fdopen(iVar3,"r+");
      if (pFVar5 != (FILE *)0x0) {
        iVar1 = flock(iVar3,6);
        if (iVar1 != -1) {
          uVar4 = getpid();
          iVar1 = fprintf(pFVar5,"%d\n",(ulong)uVar4);
          if (iVar1 == 0) {
            fwrite("Can\'t write pid.\n",0x11,1,_stderr);
            close(iVar3);
            return 1;
          }
          fflush(pFVar5);
          if (uVar4 == 0) {
            return 1;
          }
          return 0;
        }
        iVar3 = __isoc99_fscanf(pFVar5,"%d",&local_2c);
        fclose(pFVar5);
        if (iVar3 == 1) {
          fprintf(_stderr,"Can\'t lock pidfile, lock is held by pid %d.\n",(ulong)local_2c);
          return 1;
        }
        pcVar7 = "Can\'t lock and read pidfile.\n";
        sStack_40 = 0x1d;
        goto LAB_00113026;
      }
      pcVar7 = "Can\'t open %s.\n";
    }
    fprintf(_stderr,pcVar7,pidfile);
  }
  else {
    pcVar7 = "Can\'t daemonize.\n";
    sStack_40 = 0x11;
LAB_00113026:
    fwrite(pcVar7,sStack_40,1,_stderr);
  }
  return 1;
}

Assistant:

int
daemon_init(const char *pidfile) {
	int pid = check_pid(pidfile);

	if (pid) {
		fprintf(stderr, "Skynet is already running, pid = %d.\n", pid);
		return 1;
	}

#ifdef __APPLE__
	fprintf(stderr, "'daemon' is deprecated: first deprecated in OS X 10.5 , use launchd instead.\n");
#else
	if (daemon(1,0)) {
		fprintf(stderr, "Can't daemonize.\n");
		return 1;
	}
#endif

	pid = write_pid(pidfile);
	if (pid == 0) {
		return 1;
	}

	return 0;
}